

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iter.h
# Opt level: O3

optional<viras::Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>_>
* __thiscall
viras::iter::
NatIter<viras::Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>_>
::next(optional<viras::Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>_>
       *__return_storage_ptr__,
      NatIter<viras::Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>_>
      *this)

{
  RationalConstantType *u;
  InnerType *u_00;
  RationalConstantType *r;
  RationalConstantType *v;
  InnerType *v_00;
  Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>
  out;
  Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>
  *local_a8;
  __mpz_struct local_a0;
  __mpz_struct local_90;
  Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>
  local_80;
  Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>
  local_58;
  
  local_a8 = (this->_cur).
             super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Kernel::RationalConstantType>
             .config;
  u = &(this->_cur).
       super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Kernel::RationalConstantType>
       .inner;
  Kernel::IntegerConstantType::IntegerConstantType((IntegerConstantType *)&local_a0,&u->_num);
  u_00 = &(this->_cur).
          super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Kernel::RationalConstantType>
          .inner._den;
  Kernel::IntegerConstantType::IntegerConstantType((IntegerConstantType *)&local_90,u_00);
  local_80.
  super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Kernel::RationalConstantType>
  .config = (this->_cur).
            super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Kernel::RationalConstantType>
            .config;
  r = &local_80.
       super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Kernel::RationalConstantType>
       .inner;
  Kernel::IntegerConstantType::IntegerConstantType(&r->_num,&u->_num);
  Kernel::IntegerConstantType::IntegerConstantType
            (&local_80.
              super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Kernel::RationalConstantType>
              .inner._den,u_00);
  sugar::operator+(&local_58,&local_80,1);
  v = &local_58.
       super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Kernel::RationalConstantType>
       .inner;
  (this->_cur).
  super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Kernel::RationalConstantType>
  .config = local_58.
            super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Kernel::RationalConstantType>
            .config;
  mpz_swap((__mpz_struct *)u,(__mpz_struct *)v);
  v_00 = &local_58.
          super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Kernel::RationalConstantType>
          .inner._den;
  mpz_swap(u_00->_val,v_00->_val);
  mpz_clear(v_00->_val);
  mpz_clear((__mpz_struct *)v);
  mpz_clear(local_80.
            super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Kernel::RationalConstantType>
            .inner._den._val);
  mpz_clear((__mpz_struct *)r);
  std::
  _Optional_payload_base<viras::Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>>,viras::DefaultOpts>>>
  ::
  _Storage<viras::Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>>,viras::DefaultOpts>>,false>
  ::
  _Storage<viras::Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>>,viras::DefaultOpts>>>
            ((_Storage<viras::Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>>,viras::DefaultOpts>>,false>
              *)__return_storage_ptr__,&local_a8);
  (__return_storage_ptr__->
  super__Optional_base<viras::Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>,_false,_false>
  )._M_payload.
  super__Optional_payload<viras::Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>,_true,_false,_false>
  .
  super__Optional_payload_base<viras::Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>_>
  ._M_engaged = true;
  mpz_clear(&local_90);
  mpz_clear(&local_a0);
  return __return_storage_ptr__;
}

Assistant:

std::optional<T> next() {
        auto out = _cur;
        _cur = _cur + 1;
        return out;
      }